

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O3

__pid_t __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::wait
          (tsqueue<blcl::net::owned_message<MsgType>_> *this,void *__stat_loc)

{
  bool bVar1;
  undefined3 extraout_var;
  undefined3 extraout_var_00;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  __pid_t _Var2;
  
  bVar1 = empty(this);
  _Var2 = CONCAT31(extraout_var,bVar1);
  if (bVar1) {
    do {
      local_30._M_owns = false;
      local_30._M_device = &this->to_update_mtx_;
      std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      std::condition_variable::wait((unique_lock *)&this->to_update_cv_);
      std::unique_lock<std::mutex>::~unique_lock(&local_30);
      bVar1 = empty(this);
      _Var2 = CONCAT31(extraout_var_00,bVar1);
    } while (bVar1);
  }
  return _Var2;
}

Assistant:

void wait() {
            while (empty()) {
                std::unique_lock<std::mutex> lk(to_update_mtx_);
                to_update_cv_.wait(lk);
            }
        }